

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

void comex_make_progress(void)

{
  char **ppcVar1;
  uint uVar2;
  void *__src;
  lock_link *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  message_t *__ptr;
  void *__ptr_00;
  int iVar7;
  get_t *pgVar8;
  uint *__ptr_01;
  barrier_t *pbVar9;
  comex_lock_t *pcVar10;
  long lVar11;
  char *pcVar12;
  get_t *pgVar13;
  int op;
  int dest;
  get_link *pgVar14;
  comex_lock_t *pcVar15;
  get_t *need_to_free;
  get_t *__ptr_02;
  uint *__src_00;
  comex_lock_t *__ptr_03;
  bool bVar16;
  long lStackY_a0;
  int flag;
  long *local_88;
  int local_7c;
  char *local_78;
  void *local_70;
  MPI_Status iprobe_status;
  MPI_Status recv_status;
  
  do {
    local_7c = 0;
    while (l_state.mq_head != (message_t *)0x0) {
      if (l_state.mq_tail == (message_t *)0x0) {
        __assert_fail("l_state.mq_tail",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd3,"int _mq_test()");
      }
      if ((l_state.mq_head)->request == (MPI_Request)&ompi_request_null) {
        __assert_fail("l_state.mq_head->request != MPI_REQUEST_NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd4,"int _mq_test()");
      }
      iVar7 = MPI_Test(&(l_state.mq_head)->request,&flag,&recv_status);
      __ptr = l_state.mq_head;
      if (iVar7 != 0) {
        __assert_fail("MPI_SUCCESS == rc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd7,"int _mq_test()");
      }
      if (flag == 0) break;
      if (l_state.mq_head == (message_t *)0x0) {
        __assert_fail("l_state.mq_head",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe1,"void _mq_pop()");
      }
      if (l_state.mq_tail == (message_t *)0x0) {
        __assert_fail("l_state.mq_tail",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe2,"void _mq_pop()");
      }
      if ((l_state.mq_head)->request != (MPI_Request)&ompi_request_null) {
        __assert_fail("l_state.mq_head->request == MPI_REQUEST_NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe3,"void _mq_pop()");
      }
      ppcVar1 = &(l_state.mq_head)->message;
      l_state.mq_head = (l_state.mq_head)->next;
      free(*ppcVar1);
      free(__ptr);
      if (l_state.mq_head == (message_t *)0x0) {
        l_state.mq_tail = (message_t *)0x0;
      }
      iVar7 = l_state.mq_size + -1;
      bVar16 = l_state.mq_size < 1;
      l_state.mq_size = iVar7;
      if (bVar16) {
        __assert_fail("l_state.mq_size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xf1,"void _mq_pop()");
      }
    }
    __ptr_02 = l_state.gq_head;
    l_state.gq_head = (get_t *)0x0;
    l_state.gq_tail = (get_t *)0x0;
    pgVar8 = (get_t *)0x0;
LAB_00107b8d:
    if (__ptr_02 != (get_t *)0x0) {
      if (*__ptr_02->notify_address == '\0') break;
      pgVar13 = (get_t *)&l_state.gq_head;
      if (pgVar8 != (get_t *)0x0) {
        pgVar13 = pgVar8;
      }
      pgVar13->next = __ptr_02;
      pgVar14 = __ptr_02->next;
      l_state.gq_tail = __ptr_02;
      goto LAB_00107bd6;
    }
    MPI_Iprobe(0xffffffffffffffff,0x6be8,l_state.world_comm,&local_7c,&iprobe_status);
    iVar7 = 0x28;
    if (local_7c == 0) goto LAB_00107fb5;
    MPI_Get_count(&iprobe_status,&ompi_mpi_char,&flag);
    __ptr_01 = (uint *)_my_malloc((long)flag);
    MPI_Recv(__ptr_01,flag,&ompi_mpi_char,iprobe_status.MPI_SOURCE,0x6be8,l_state.world_comm,
             &recv_status);
    dest = iprobe_status.MPI_SOURCE;
    if (0x13 < *__ptr_01) {
      printf("[%d] header operation not recognized: %d\n",(ulong)(uint)l_state.rank);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x1a0,"void comex_make_progress(void)");
    }
    __src_00 = __ptr_01 + 10;
    op = 0x25;
    lStackY_a0 = 4;
    switch(*__ptr_01) {
    case 0:
      memcpy(*(void **)(__ptr_01 + 2),__src_00,(long)(int)__ptr_01[6]);
      break;
    case 1:
      local_88 = (long *)CONCAT44(local_88._4_4_,iprobe_status.MPI_SOURCE);
      *__ptr_01 = 2;
      pcVar12 = (char *)_my_malloc((long)(int)__ptr_01[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_01 + 2);
      uVar5 = *(undefined8 *)(__ptr_01 + 4);
      uVar6 = *(undefined8 *)(__ptr_01 + 6);
      *(undefined8 *)pcVar12 = *(undefined8 *)__ptr_01;
      *(undefined8 *)(pcVar12 + 8) = uVar4;
      *(undefined8 *)(pcVar12 + 0x10) = uVar5;
      *(undefined8 *)(pcVar12 + 0x18) = uVar6;
      *(undefined8 *)(pcVar12 + 0x20) = *(undefined8 *)(__ptr_01 + 8);
      uVar2 = __ptr_01[6];
      memcpy(pcVar12 + 0x28,*(void **)(__ptr_01 + 2),(long)(int)uVar2);
      iVar7 = uVar2 + 0x28;
      dest = (int)local_88;
      goto LAB_00107fa5;
    default:
      memcpy(*(void **)(__ptr_01 + 4),__src_00,(long)(int)__ptr_01[6]);
    case 0x12:
      **(undefined1 **)(__ptr_01 + 8) = 0;
      break;
    case 3:
      goto switchD_00107c85_caseD_3;
    case 4:
      op = 0x26;
      goto LAB_00107da5;
    case 5:
      op = 0x27;
      goto switchD_00107c85_caseD_3;
    case 6:
      op = iVar7;
      goto LAB_00107da5;
    case 7:
      op = 0x29;
      lStackY_a0 = 0x10;
      goto switchD_00107c85_caseD_3;
    case 8:
      op = 0x2a;
LAB_00107da5:
      lStackY_a0 = 8;
switchD_00107c85_caseD_3:
      _acc(op,__ptr_01[6],*(void **)(__ptr_01 + 2),(void *)(lStackY_a0 + (long)__src_00),__src_00);
      break;
    case 9:
      pcVar12 = (char *)_my_malloc(0x28);
      uVar4 = *(undefined8 *)(__ptr_01 + 2);
      uVar5 = *(undefined8 *)(__ptr_01 + 4);
      uVar6 = *(undefined8 *)(__ptr_01 + 6);
      *(undefined8 *)pcVar12 = *(undefined8 *)__ptr_01;
      *(undefined8 *)(pcVar12 + 8) = uVar4;
      *(undefined8 *)(pcVar12 + 0x10) = uVar5;
      *(undefined8 *)(pcVar12 + 0x18) = uVar6;
      *(undefined8 *)(pcVar12 + 0x20) = *(undefined8 *)(__ptr_01 + 8);
      pcVar12[0] = '\n';
      pcVar12[1] = '\0';
      pcVar12[2] = '\0';
      pcVar12[3] = '\0';
      goto LAB_00107fa5;
    case 10:
      **(int **)(__ptr_01 + 8) = **(int **)(__ptr_01 + 8) + -1;
      break;
    case 0xb:
      pbVar9 = (barrier_t *)_my_malloc(0x18);
      pbVar9->next = (barrier_link *)0x0;
      pbVar9->world_rank = dest;
      pbVar9->notify_address = *(void **)(__ptr_01 + 8);
      if (l_state.bq_head == (barrier_t *)0x0) {
        l_state.bq_tail = (barrier_t *)&l_state.bq_head;
      }
      (l_state.bq_tail)->next = pbVar9;
      l_state.bq_tail = pbVar9;
      break;
    case 0xc:
      **(char **)(__ptr_01 + 8) = **(char **)(__ptr_01 + 8) + '\x01';
      break;
    case 0xd:
      local_70 = (void *)CONCAT44(local_70._4_4_,iprobe_status.MPI_SOURCE);
      *__ptr_01 = 0xe;
      local_78 = (char *)_my_malloc((long)(int)__ptr_01[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_01 + 2);
      uVar5 = *(undefined8 *)(__ptr_01 + 4);
      uVar6 = *(undefined8 *)(__ptr_01 + 6);
      *(undefined8 *)local_78 = *(undefined8 *)__ptr_01;
      *(undefined8 *)(local_78 + 8) = uVar4;
      *(undefined8 *)(local_78 + 0x10) = uVar5;
      *(undefined8 *)(local_78 + 0x18) = uVar6;
      *(undefined8 *)(local_78 + 0x20) = *(undefined8 *)(__ptr_01 + 8);
      local_88 = *(long **)(__ptr_01 + 2);
      uVar2 = __ptr_01[6];
      memcpy(local_78 + 0x28,local_88,(long)(int)uVar2);
      if ((long)(int)uVar2 == 8) {
        *local_88 = *local_88 + *(long *)__src_00;
        iVar7 = 0x30;
      }
      else {
        if (uVar2 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                        ,0x704,"void _fetch_and_add_request_handler(header_t *, char *, int)");
        }
        *(uint *)local_88 = (int)*local_88 + __ptr_01[10];
        iVar7 = __ptr_01[6] + 0x28;
      }
      pcVar12 = local_78;
      dest = (int)local_70;
      goto LAB_00107fa5;
    case 0xf:
      if ((long)(int)__ptr_01[6] < 1) {
        __assert_fail("header->length > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x72b,"void _swap_request_handler(header_t *, char *, int)");
      }
      local_88 = (long *)CONCAT44(local_88._4_4_,iprobe_status.MPI_SOURCE);
      local_70 = _my_malloc((long)(int)__ptr_01[6]);
      pcVar12 = (char *)(long)(int)__ptr_01[6];
      local_78 = pcVar12;
      memcpy(local_70,__src_00,(size_t)pcVar12);
      __src = *(void **)(__ptr_01 + 2);
      memcpy(__src_00,__src,(size_t)pcVar12);
      __ptr_00 = local_70;
      memcpy(__src,local_70,(size_t)local_78);
      free(__ptr_00);
      *__ptr_01 = 0x10;
      pcVar12 = (char *)_my_malloc((long)(int)__ptr_01[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_01 + 2);
      uVar5 = *(undefined8 *)(__ptr_01 + 4);
      uVar6 = *(undefined8 *)(__ptr_01 + 6);
      *(undefined8 *)pcVar12 = *(undefined8 *)__ptr_01;
      *(undefined8 *)(pcVar12 + 8) = uVar4;
      *(undefined8 *)(pcVar12 + 0x10) = uVar5;
      *(undefined8 *)(pcVar12 + 0x18) = uVar6;
      *(undefined8 *)(pcVar12 + 0x20) = *(undefined8 *)(__ptr_01 + 8);
      uVar2 = __ptr_01[6];
      memcpy(pcVar12 + 0x28,__src_00,(long)(int)uVar2);
      iVar7 = uVar2 + 0x28;
      dest = (int)local_88;
LAB_00107fa5:
      _mq_push(dest,pcVar12,iVar7);
      break;
    case 0x11:
      uVar2 = __ptr_01[6];
      local_88 = *(long **)(__ptr_01 + 8);
      pcVar10 = (comex_lock_t *)_my_malloc(0x18);
      pcVar10->next = (lock_link *)0x0;
      pcVar10->rank = dest;
      pcVar10->id = uVar2;
      pcVar10->notify_address = local_88;
      if (l_state.lq_tail == (comex_lock_t *)0x0) {
        if (l_state.lq_head != (comex_lock_t *)0x0) {
          __assert_fail("NULL == l_state.lq_head",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                        ,0x790,"void _lq_push(int, int, char *)");
        }
        l_state.lq_tail = (comex_lock_t *)&l_state.lq_head;
      }
      else if ((l_state.lq_tail)->next != (lock_link *)0x0) {
        __assert_fail("NULL == l_state.lq_tail->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x788,"void _lq_push(int, int, char *)");
      }
      (l_state.lq_tail)->next = pcVar10;
      l_state.lq_tail = pcVar10;
      break;
    case 0x13:
      lVar11 = (long)(int)__ptr_01[6];
      if (lVar11 < 0) {
        __assert_fail("header->length >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x76e,"void _unlock_request_handler(header_t *, int)");
      }
      if (l_state.num_mutexes <= (int)__ptr_01[6]) {
        __assert_fail("header->length < l_state.num_mutexes",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x76f,"void _unlock_request_handler(header_t *, int)");
      }
      if (l_state.mutexes[lVar11] != iprobe_status.MPI_SOURCE) {
        __assert_fail("l_state.mutexes[header->length] == proc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x771,"void _unlock_request_handler(header_t *, int)");
      }
      l_state.mutexes[lVar11] = -1;
    }
    free(__ptr_01);
LAB_00107fb5:
    local_88 = (long *)CONCAT44(local_88._4_4_,(uint)(pgVar8 != (get_t *)0x0));
    pcVar10 = (comex_lock_t *)0x0;
    pcVar15 = (comex_lock_t *)0x0;
    __ptr_03 = l_state.lq_head;
    while (__ptr_03 != (comex_lock_t *)0x0) {
      if (l_state.mutexes[__ptr_03->id] < 0) {
        l_state.mutexes[__ptr_03->id] = __ptr_03->rank;
        pcVar12 = (char *)_my_malloc(0x28);
        pcVar12[0] = '\x12';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[8] = '\0';
        pcVar12[9] = '\0';
        pcVar12[10] = '\0';
        pcVar12[0xb] = '\0';
        pcVar12[0xc] = '\0';
        pcVar12[0xd] = '\0';
        pcVar12[0xe] = '\0';
        pcVar12[0xf] = '\0';
        pcVar12[0x10] = '\0';
        pcVar12[0x11] = '\0';
        pcVar12[0x12] = '\0';
        pcVar12[0x13] = '\0';
        pcVar12[0x14] = '\0';
        pcVar12[0x15] = '\0';
        pcVar12[0x16] = '\0';
        pcVar12[0x17] = '\0';
        pcVar12[0x18] = -1;
        pcVar12[0x19] = -1;
        pcVar12[0x1a] = -1;
        pcVar12[0x1b] = -1;
        *(void **)(pcVar12 + 0x20) = __ptr_03->notify_address;
        _mq_push(__ptr_03->rank,pcVar12,0x28);
        plVar3 = __ptr_03->next;
        free(__ptr_03);
        __ptr_03 = plVar3;
      }
      else {
        if (pcVar15 == (comex_lock_t *)0x0) {
          bVar16 = pcVar10 != (comex_lock_t *)0x0;
          pcVar10 = __ptr_03;
          if (bVar16) {
            __assert_fail("NULL == new_lock_head",
                          "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                          ,0x7cb,"int _lq_progress(void)");
          }
        }
        else {
          if (pcVar10 == (comex_lock_t *)0x0) {
            __assert_fail("new_lock_head",
                          "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                          ,0x7c5,"int _lq_progress(void)");
          }
          if (pcVar15->next != (lock_link *)0x0) {
            __assert_fail("NULL == new_lock_tail->next",
                          "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                          ,0x7c6,"int _lq_progress(void)");
          }
          pcVar15->next = __ptr_03;
        }
        plVar3 = __ptr_03->next;
        __ptr_03->next = (lock_link *)0x0;
        pcVar15 = __ptr_03;
        __ptr_03 = plVar3;
      }
    }
    l_state.lq_head = pcVar10;
    l_state.lq_tail = pcVar15;
    if (((int)local_88 == 0 && local_7c == 0) && l_state.mq_size == 0) {
      return;
    }
  } while( true );
  pgVar14 = __ptr_02->next;
  free(__ptr_02->notify_address);
  free(__ptr_02);
  pgVar8 = (get_t *)0x0;
  __ptr_02 = pgVar14;
  if (l_state.gq_tail != (get_t *)0x0) {
LAB_00107bd6:
    pgVar8 = l_state.gq_tail;
    (l_state.gq_tail)->next = (get_link *)0x0;
    __ptr_02 = pgVar14;
  }
  goto LAB_00107b8d;
}

Assistant:

void comex_make_progress(void)
{
    int iprobe_flag=0;
    MPI_Status iprobe_status;
    int get_flag=0;
    int lock_flag=0;

#if DEBUG
    printf("[%d] comex_make_progress()\n", l_state.rank);
#endif

    do {
        iprobe_flag = 0;
        get_flag = 0;

        /* test for outgoing message completion only if we have outgoing
         * messages; we test from the head only */
        if (l_state.mq_head) {
            while (l_state.mq_head && _mq_test()) {
                _mq_pop();
            }
        }

        /* test for incoming get responses */
        if (_gq_test()) {
            get_flag = 1;
        }

        /* test for incoming messages */
        MPI_Iprobe(MPI_ANY_SOURCE, COMEX_TAG, l_state.world_comm,
                &iprobe_flag, &iprobe_status);
        if (iprobe_flag) {
            int length;
            char *message;
            char *payload;
            header_t *header;
            MPI_Status recv_status;

            /* allocate message buffer and get message */
            MPI_Get_count(&iprobe_status, MPI_CHAR, &length);
#if DEBUG
            printf("[%d] iprobe source=%d length=%d\n",
                    l_state.rank, iprobe_status.MPI_SOURCE, length);
#endif

            message = _my_malloc(length);
            MPI_Recv(message, length, MPI_CHAR,
                    iprobe_status.MPI_SOURCE, COMEX_TAG,
                    l_state.world_comm, &recv_status);
            header = (header_t*)message;
            payload = message + sizeof(header_t);
            /* dispatch message handler */
            switch (header->operation) {
                case OP_PUT:
                    _put_handler(header, payload);
                    break;
                case OP_GET_REQUEST:
                    _get_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_GET_RESPONSE:
                    _get_response_handler(header, payload);
                    break;
                case OP_ACC_INT:
                case OP_ACC_DBL:
                case OP_ACC_FLT:
                case OP_ACC_CPL:
                case OP_ACC_DCP:
                case OP_ACC_LNG:
                    _acc_handler(header, payload);
                    break;
                case OP_FENCE_REQUEST:
                    _fence_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FENCE_RESPONSE:
                    _fence_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_REQUEST:
                    _barrier_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_RESPONSE:
                    _barrier_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_REQUEST:
                    _fetch_and_add_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_RESPONSE:
                    _fetch_and_add_response_handler(header, payload);
                    break;
                case OP_SWAP_REQUEST:
                    _swap_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_SWAP_RESPONSE:
                    _swap_response_handler(header, payload);
                    break;
                case OP_LOCK_REQUEST:
                    _lock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_LOCK_RESPONSE:
                    _lock_response_handler(header);
                    break;
                case OP_UNLOCK:
                    _unlock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                default:
                    printf("[%d] header operation not recognized: %d\n",
                            l_state.rank, header->operation);
                    assert(0);
            }

            /* free the message buffer */
            _my_free(message);
        }

        lock_flag = _lq_progress();

        /* loop until we run out of incoming and outgoing messages */
#if DEBUG
        printf("[%d] iprobe_flag=%d || get_flag=%d || l_state.mq_size=%d lock_flag=%d\n",
                l_state.rank, iprobe_flag, get_flag, l_state.mq_size, lock_flag);
#endif
    } while (iprobe_flag || get_flag || l_state.mq_size);
}